

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizingSolver.cpp
# Opt level: O0

void __thiscall SAT::MinimizingSolver::MinimizingSolver(MinimizingSolver *this,SATSolver *inner)

{
  SATSolver *in_RSI;
  SATSolver *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  SATSolver *size;
  Stack<SAT::SATClause_*> *in_stack_ffffffffffffffb0;
  DArray<Lib::Stack<SAT::SATClause_*>_> *this_00;
  DynamicHeap<unsigned_int,_SAT::MinimizingSolver::CntComparator,_Lib::ArrayMap<unsigned_long>,_unsigned_int>
  *this_01;
  CntComparator cmp;
  CntComparator local_28 [3];
  SATSolver *local_10;
  
  local_10 = in_RSI;
  SATSolver::SATSolver(in_RDI);
  in_RDI->_vptr_SATSolver = (_func_int **)&PTR__MinimizingSolver_013214e0;
  *(undefined4 *)&in_RDI[1]._vptr_SATSolver = 0;
  Lib::ScopedPtr<SAT::SATSolver>::ScopedPtr((ScopedPtr<SAT::SATSolver> *)(in_RDI + 2),local_10);
  *(undefined1 *)&in_RDI[3]._vptr_SATSolver = 0;
  cmp._ctr = (CntArray *)(in_RDI + 4);
  Lib::Stack<SAT::SATClause_*>::Stack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_01 = (DynamicHeap<unsigned_int,_SAT::MinimizingSolver::CntComparator,_Lib::ArrayMap<unsigned_long>,_unsigned_int>
             *)(in_RDI + 8);
  Lib::DArray<bool>::DArray((DArray<bool> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (DArray<Lib::Stack<SAT::SATClause_*>_> *)(in_RDI + 0xb);
  Lib::DArray<Lib::Stack<SAT::SATClause_*>_>::DArray(this_00,in_stack_ffffffffffffffa8);
  size = in_RDI + 0xe;
  Lib::DArray<unsigned_int>::DArray((DArray<unsigned_int> *)this_00,(size_t)size);
  CntComparator::CntComparator(local_28,(CntArray *)(in_RDI + 0xe));
  Lib::
  DynamicHeap<unsigned_int,_SAT::MinimizingSolver::CntComparator,_Lib::ArrayMap<unsigned_long>,_unsigned_int>
  ::DynamicHeap(this_01,cmp);
  Lib::DArray<Lib::Stack<SAT::SATClause_*>_>::DArray(this_00,(size_t)size);
  Lib::DHSet<SAT::SATClause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
            ((DHSet<SAT::SATClause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0xa9d0a0);
  return;
}

Assistant:

MinimizingSolver::MinimizingSolver(SATSolver* inner)
 : _varCnt(0), _inner(inner), _assignmentValid(false), _heap(CntComparator(_unsClCnt))
{
}